

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O1

void __thiscall ncnn::Proposal::Proposal(Proposal *this)

{
  Mat *pMVar1;
  int *piVar2;
  undefined8 *puVar3;
  void *pvVar4;
  void *pvVar5;
  
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Proposal_0013c110;
  pMVar1 = &this->ratios;
  (this->super_Layer).one_blob_only = false;
  (this->super_Layer).support_inplace = false;
  memset(pMVar1,0,0x90);
  if ((((this->ratios).dims != 1) || ((this->ratios).w != 3)) || ((this->ratios).elemsize != 4)) {
    piVar2 = (this->ratios).refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) && (pMVar1->data != (void *)0x0)) {
        free(*(void **)((long)pMVar1->data + -8));
      }
    }
    (this->ratios).h = 0;
    (this->ratios).c = 0;
    (this->ratios).cstep = 0;
    (this->ratios).elemsize = 0;
    (this->ratios).dims = 0;
    (this->ratios).w = 0;
    pMVar1->data = (void *)0x0;
    (this->ratios).refcount = (int *)0x0;
    (this->ratios).elemsize = 4;
    (this->ratios).dims = 1;
    (this->ratios).w = 3;
    (this->ratios).h = 1;
    (this->ratios).c = 1;
    (this->ratios).cstep = 3;
    pvVar4 = malloc(0x28);
    pvVar5 = (void *)((long)pvVar4 + 0x17U & 0xfffffffffffffff0);
    *(void **)((long)pvVar5 - 8) = pvVar4;
    (this->ratios).data = pvVar5;
    (this->ratios).refcount = (int *)((long)pvVar5 + 0xc);
    *(undefined4 *)((long)pvVar5 + 0xc) = 1;
  }
  pMVar1 = &this->scales;
  puVar3 = (undefined8 *)(this->ratios).data;
  *puVar3 = 0x3f8000003f000000;
  *(undefined4 *)(puVar3 + 1) = 0x40000000;
  if ((((this->scales).dims != 1) || ((this->scales).w != 3)) || ((this->scales).elemsize != 4)) {
    piVar2 = (this->scales).refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) && (pMVar1->data != (void *)0x0)) {
        free(*(void **)((long)pMVar1->data + -8));
      }
    }
    (this->scales).h = 0;
    (this->scales).c = 0;
    (this->scales).cstep = 0;
    (this->scales).elemsize = 0;
    (this->scales).dims = 0;
    (this->scales).w = 0;
    pMVar1->data = (void *)0x0;
    (this->scales).refcount = (int *)0x0;
    (this->scales).elemsize = 4;
    (this->scales).dims = 1;
    (this->scales).w = 3;
    (this->scales).h = 1;
    (this->scales).c = 1;
    (this->scales).cstep = 3;
    pvVar4 = malloc(0x28);
    pvVar5 = (void *)((long)pvVar4 + 0x17U & 0xfffffffffffffff0);
    *(void **)((long)pvVar5 - 8) = pvVar4;
    (this->scales).data = pvVar5;
    (this->scales).refcount = (int *)((long)pvVar5 + 0xc);
    *(undefined4 *)((long)pvVar5 + 0xc) = 1;
  }
  puVar3 = (undefined8 *)pMVar1->data;
  *puVar3 = 0x4180000041000000;
  *(undefined4 *)(puVar3 + 1) = 0x42000000;
  return;
}

Assistant:

Proposal::Proposal()
{
    one_blob_only = false;
    support_inplace = false;

    // TODO load from param
    ratios.create(3);
    ratios[0] = 0.5f;
    ratios[1] = 1.f;
    ratios[2] = 2.f;

    scales.create(3);
    scales[0] = 8.f;
    scales[1] = 16.f;
    scales[2] = 32.f;
}